

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int isoent_alloc_path_table(archive_write *a,vdd *vdd,int max_depth)

{
  int iVar1;
  path_table *ppVar2;
  ulong uVar3;
  bool bVar4;
  
  vdd->max_depth = max_depth;
  ppVar2 = (path_table *)malloc((long)max_depth << 5);
  vdd->pathtbl = ppVar2;
  if (ppVar2 == (path_table *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
    iVar1 = -0x1e;
  }
  else {
    iVar1 = 0;
    uVar3 = (ulong)(uint)max_depth;
    if (max_depth < 1) {
      uVar3 = 0;
    }
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      ppVar2->first = (isoent *)0x0;
      ppVar2->last = &ppVar2->first;
      ppVar2->sorted = (isoent **)0x0;
      ppVar2->cnt = 0;
      ppVar2 = ppVar2 + 1;
    }
  }
  return iVar1;
}

Assistant:

static int
isoent_alloc_path_table(struct archive_write *a, struct vdd *vdd,
    int max_depth)
{
	int i;

	vdd->max_depth = max_depth;
	vdd->pathtbl = malloc(sizeof(*vdd->pathtbl) * vdd->max_depth);
	if (vdd->pathtbl == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	for (i = 0; i < vdd->max_depth; i++) {
		vdd->pathtbl[i].first = NULL;
		vdd->pathtbl[i].last = &(vdd->pathtbl[i].first);
		vdd->pathtbl[i].sorted = NULL;
		vdd->pathtbl[i].cnt = 0;
	}
	return (ARCHIVE_OK);
}